

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcol.c
# Opt level: O1

int ffgsv(fitsfile *fptr,int datatype,long *blc,long *trc,long *inc,void *nulval,void *array,
         int *anynul,int *status)

{
  int iVar1;
  LONGLONG LVar2;
  ulong uVar3;
  float nulval_00;
  double nulval_01;
  uchar nulval_02;
  char nulval_03;
  unsigned_short nulval_04;
  short nulval_05;
  uint nulval_06;
  unsigned_long nulval_07;
  ULONGLONG nulval_08;
  long nulval_09;
  int naxis;
  long *local_80;
  long naxes [9];
  
  if (0 < *status) {
    return *status;
  }
  local_80 = inc;
  ffgidm(fptr,&naxis,status);
  ffgisz(fptr,9,naxes,status);
  iVar1 = fits_is_compressed_image(fptr,status);
  if (iVar1 == 0) {
    LVar2 = 1;
    uVar3 = 0;
    if (0 < naxis) {
      do {
        if (((local_80[uVar3] != 1) || (blc[uVar3] != 1)) || (trc[uVar3] != naxes[uVar3]))
        goto LAB_001528f9;
        LVar2 = LVar2 * naxes[uVar3];
        uVar3 = uVar3 + 1;
      } while ((uint)naxis != uVar3);
      uVar3 = (ulong)(uint)naxis;
    }
LAB_001528f9:
    if ((int)uVar3 == naxis) {
      ffgpxv(fptr,datatype,blc,LVar2,nulval,array,anynul,status);
      goto LAB_00152ef2;
    }
  }
  if (datatype < 0x28) {
    if (datatype < 0x15) {
      if (datatype == 0xb) {
        if (nulval == (void *)0x0) {
          nulval_02 = '\0';
        }
        else {
          nulval_02 = *nulval;
        }
        ffgsvb(fptr,1,naxis,naxes,blc,trc,local_80,nulval_02,(uchar *)array,anynul,status);
        goto LAB_00152ef2;
      }
      if (datatype == 0xc) {
        if (nulval == (void *)0x0) {
          nulval_03 = '\0';
        }
        else {
          nulval_03 = *nulval;
        }
        ffgsvsb(fptr,1,naxis,naxes,blc,trc,local_80,nulval_03,(char *)array,anynul,status);
        goto LAB_00152ef2;
      }
      if (datatype == 0x14) {
        if (nulval == (void *)0x0) {
          nulval_04 = 0;
        }
        else {
          nulval_04 = *nulval;
        }
        ffgsvui(fptr,1,naxis,naxes,blc,trc,local_80,nulval_04,(unsigned_short *)array,anynul,status)
        ;
        goto LAB_00152ef2;
      }
    }
    else {
      if (datatype == 0x15) {
        if (nulval == (void *)0x0) {
          nulval_05 = 0;
        }
        else {
          nulval_05 = *nulval;
        }
        ffgsvi(fptr,1,naxis,naxes,blc,trc,local_80,nulval_05,(short *)array,anynul,status);
        goto LAB_00152ef2;
      }
      if (datatype == 0x1e) {
        if (nulval == (void *)0x0) {
          nulval_06 = 0;
        }
        else {
          nulval_06 = *nulval;
        }
        ffgsvuk(fptr,1,naxis,naxes,blc,trc,local_80,nulval_06,(uint *)array,anynul,status);
        goto LAB_00152ef2;
      }
      if (datatype == 0x1f) {
        if (nulval == (void *)0x0) {
          iVar1 = 0;
        }
        else {
          iVar1 = *nulval;
        }
        ffgsvk(fptr,1,naxis,naxes,blc,trc,local_80,iVar1,(int *)array,anynul,status);
        goto LAB_00152ef2;
      }
    }
  }
  else if (datatype < 0x50) {
    if (datatype == 0x28) {
      if (nulval == (void *)0x0) {
        nulval_07 = 0;
      }
      else {
        nulval_07 = *nulval;
      }
      ffgsvuj(fptr,1,naxis,naxes,blc,trc,local_80,nulval_07,(unsigned_long *)array,anynul,status);
      goto LAB_00152ef2;
    }
    if (datatype == 0x29) {
      if (nulval == (void *)0x0) {
        nulval_09 = 0;
      }
      else {
        nulval_09 = *nulval;
      }
      ffgsvj(fptr,1,naxis,naxes,blc,trc,local_80,nulval_09,(long *)array,anynul,status);
      goto LAB_00152ef2;
    }
    if (datatype == 0x2a) {
      if (nulval == (void *)0x0) {
        nulval_00 = 0.0;
      }
      else {
        nulval_00 = *nulval;
      }
      ffgsve(fptr,1,naxis,naxes,blc,trc,local_80,nulval_00,(float *)array,anynul,status);
      goto LAB_00152ef2;
    }
  }
  else {
    if (datatype == 0x50) {
      if (nulval == (void *)0x0) {
        nulval_08 = 0;
      }
      else {
        nulval_08 = *nulval;
      }
      ffgsvujj(fptr,1,naxis,naxes,blc,trc,local_80,nulval_08,(ULONGLONG *)array,anynul,status);
      goto LAB_00152ef2;
    }
    if (datatype == 0x51) {
      if (nulval == (void *)0x0) {
        LVar2 = 0;
      }
      else {
        LVar2 = *nulval;
      }
      ffgsvjj(fptr,1,naxis,naxes,blc,trc,local_80,LVar2,(LONGLONG *)array,anynul,status);
      goto LAB_00152ef2;
    }
    if (datatype == 0x52) {
      if (nulval == (void *)0x0) {
        nulval_01 = 0.0;
      }
      else {
        nulval_01 = *nulval;
      }
      ffgsvd(fptr,1,naxis,naxes,blc,trc,local_80,nulval_01,(double *)array,anynul,status);
      goto LAB_00152ef2;
    }
  }
  *status = 0x19a;
LAB_00152ef2:
  return *status;
}

Assistant:

int ffgsv(  fitsfile *fptr,   /* I - FITS file pointer                       */
            int  datatype,    /* I - datatype of the value                   */
            long *blc,        /* I - 'bottom left corner' of the subsection  */
            long *trc ,       /* I - 'top right corner' of the subsection    */
            long *inc,        /* I - increment to be applied in each dim.    */
            void *nulval,     /* I - value for undefined pixels              */
            void *array,      /* O - array of values that are returned       */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an section of values from the primary array. The datatype of the
  input array is defined by the 2nd argument.  Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
  Undefined elements will be set equal to NULVAL, unless NULVAL=0
  in which case no checking for undefined values will be performed.
  ANYNUL is returned with a value of .true. if any pixels are undefined.
*/
{
    int naxis, ii;
    long naxes[9];
    LONGLONG nelem = 1;

    if (*status > 0)   /* inherit input status value if > 0 */
        return(*status);

    /* get the size of the image */
    ffgidm(fptr, &naxis, status);
    ffgisz(fptr, 9, naxes, status);

    /* test for the important special case where we are reading the whole image */
    /* this is only useful for images that are not tile-compressed */
    if (!fits_is_compressed_image(fptr, status)) {
        for (ii = 0; ii < naxis; ii++) {
            if (inc[ii] != 1 || blc[ii] !=1 || trc[ii] != naxes[ii])
                break;

            nelem = nelem * naxes[ii];
        }

        if (ii == naxis) {
            /* read the whole image more efficiently */
            ffgpxv(fptr, datatype, blc, nelem, nulval, array, anynul, status);
            return(*status);
        }
    }

    if (datatype == TBYTE)
    {
      if (nulval == 0)
        ffgsvb(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (unsigned char *) array, anynul, status);
      else
        ffgsvb(fptr, 1, naxis, naxes, blc, trc, inc, *(unsigned char *) nulval,
               (unsigned char *) array, anynul, status);
    }
    else if (datatype == TSBYTE)
    {
      if (nulval == 0)
        ffgsvsb(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (signed char *) array, anynul, status);
      else
        ffgsvsb(fptr, 1, naxis, naxes, blc, trc, inc, *(signed char *) nulval,
               (signed char *) array, anynul, status);
    }
    else if (datatype == TUSHORT)
    {
      if (nulval == 0)
        ffgsvui(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (unsigned short *) array, anynul, status);
      else
        ffgsvui(fptr, 1, naxis, naxes,blc, trc, inc, *(unsigned short *) nulval,
               (unsigned short *) array, anynul, status);
    }
    else if (datatype == TSHORT)
    {
      if (nulval == 0)
        ffgsvi(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (short *) array, anynul, status);
      else
        ffgsvi(fptr, 1, naxis, naxes, blc, trc, inc, *(short *) nulval,
               (short *) array, anynul, status);
    }
    else if (datatype == TUINT)
    {
      if (nulval == 0)
        ffgsvuk(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (unsigned int *) array, anynul, status);
      else
        ffgsvuk(fptr, 1, naxis, naxes, blc, trc, inc, *(unsigned int *) nulval,
               (unsigned int *) array, anynul, status);
    }
    else if (datatype == TINT)
    {
      if (nulval == 0)
        ffgsvk(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (int *) array, anynul, status);
      else
        ffgsvk(fptr, 1, naxis, naxes, blc, trc, inc, *(int *) nulval,
               (int *) array, anynul, status);
    }
    else if (datatype == TULONG)
    {
      if (nulval == 0)
        ffgsvuj(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (unsigned long *) array, anynul, status);
      else
        ffgsvuj(fptr, 1, naxis, naxes, blc, trc, inc, *(unsigned long *) nulval,
               (unsigned long *) array, anynul, status);
    }
    else if (datatype == TLONG)
    {
      if (nulval == 0)
        ffgsvj(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (long *) array, anynul, status);
      else
        ffgsvj(fptr, 1, naxis, naxes, blc, trc, inc, *(long *) nulval,
               (long *) array, anynul, status);
    }
    else if (datatype == TULONGLONG)
    {
      if (nulval == 0)
        ffgsvujj(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (ULONGLONG *) array, anynul, status);
      else
        ffgsvujj(fptr, 1, naxis, naxes, blc, trc, inc, *(ULONGLONG *) nulval,
               (ULONGLONG *) array, anynul, status);
    }
    else if (datatype == TLONGLONG)
    {
      if (nulval == 0)
        ffgsvjj(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (LONGLONG *) array, anynul, status);
      else
        ffgsvjj(fptr, 1, naxis, naxes, blc, trc, inc, *(LONGLONG *) nulval,
               (LONGLONG *) array, anynul, status);
    }
    else if (datatype == TFLOAT)
    {
      if (nulval == 0)
        ffgsve(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (float *) array, anynul, status);
      else
        ffgsve(fptr, 1, naxis, naxes, blc, trc, inc, *(float *) nulval,
               (float *) array, anynul, status);
    }
    else if (datatype == TDOUBLE)
    {
      if (nulval == 0)
        ffgsvd(fptr, 1, naxis, naxes, blc, trc, inc, 0,
               (double *) array, anynul, status);
      else
        ffgsvd(fptr, 1, naxis, naxes, blc, trc, inc, *(double *) nulval,
               (double *) array, anynul, status);
    }
    else
      *status = BAD_DATATYPE;

    return(*status);
}